

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

uint32_t __thiscall AbstractModuleClient::latestTrodesTimestamp(AbstractModuleClient *this)

{
  int iVar1;
  void *pvVar2;
  uint32_t *puVar3;
  long lVar4;
  zmq_msg_t msg;
  
  if (this->timestampsub != (zsock_t *)0x0) {
    zmq_msg_init(&msg);
    std::mutex::lock(&this->tsmutex);
    pvVar2 = zsock_resolve(this->timestampsub);
    iVar1 = zmq_msg_recv(&msg,pvVar2,1);
    if (iVar1 == 0xc) {
      puVar3 = (uint32_t *)zmq_msg_data(&msg);
      this->lastTimestamp = *puVar3;
      lVar4 = zmq_msg_data(&msg);
      this->lastsysTimestamp = *(int64_t *)(lVar4 + 4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->tsmutex);
    zmq_msg_close(&msg);
    return this->lastTimestamp;
  }
  return 0;
}

Assistant:

uint32_t AbstractModuleClient::latestTrodesTimestamp(){
    if(!timestampsub){
        return 0;
    }
    //If zmq_recv succeeds, lastTimestamp is replaced. if not, the previous value is returned. win-win with no checks needed
    zmq_msg_t msg;
    zmq_msg_init(&msg);
    tsmutex.lock();
    if(zmq_msg_recv(&msg, zsock_resolve(timestampsub), ZMQ_DONTWAIT) == 12){
        lastTimestamp = *(uint32_t*)zmq_msg_data(&msg);
        lastsysTimestamp = *(int64_t*)((byte*)zmq_msg_data(&msg)+4);
    }
    tsmutex.unlock();
    zmq_msg_close(&msg);
    return lastTimestamp;
}